

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::setVertices
          (StateObjects *this,DeviceInterface *vk,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices)

{
  Allocation *pAVar1;
  Vector<float,_4> *__result;
  VkDevice device;
  Allocation local_70;
  Allocation local_50;
  
  device = Context::getDevice(this->m_context);
  pAVar1 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_50._vptr_Allocation = (_func_int **)&PTR__Allocation_00c234b8;
  __result = (Vector<float,_4> *)pAVar1->m_hostPtr;
  local_50.m_memory.m_internal = (pAVar1->m_memory).m_internal;
  local_50.m_offset = pAVar1->m_offset;
  local_50.m_hostPtr = __result;
  ::vk::Allocation::~Allocation(&local_50);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<tcu::Vector<float,4>*,tcu::Vector<float,4>*>
            ((vertices->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (vertices->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_finish,__result);
  pAVar1 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_50._vptr_Allocation = (_func_int **)&PTR__Allocation_00c234b8;
  local_50.m_memory.m_internal = (pAVar1->m_memory).m_internal;
  local_50.m_offset = pAVar1->m_offset;
  local_50.m_hostPtr = pAVar1->m_hostPtr;
  local_70._vptr_Allocation = (_func_int **)&PTR__Allocation_00c234b8;
  local_70.m_memory.m_internal = (pAVar1->m_memory).m_internal;
  local_70.m_offset = pAVar1->m_offset;
  local_70.m_hostPtr = pAVar1->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (vk,device,local_50.m_memory,local_70.m_offset,
             (long)(vertices->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(vertices->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  ::vk::Allocation::~Allocation(&local_70);
  ::vk::Allocation::~Allocation(&local_50);
  return;
}

Assistant:

void StateObjects::setVertices (const vk::DeviceInterface&vk, std::vector<tcu::Vec4> vertices)
{
	const vk::VkDevice device			= m_context.getDevice();

	tcu::Vec4 *ptr = reinterpret_cast<tcu::Vec4*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	std::copy(vertices.begin(), vertices.end(), ptr);

	vk::flushMappedMemoryRange(vk, device,	m_vertexBuffer->getBoundMemory().getMemory(), m_vertexBuffer->getBoundMemory().getOffset(),	vertices.size() * sizeof(vertices[0]));
}